

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O3

void __thiscall
GuidedMeshNormalFiltering::getRadiusBasedFaceNeighbor
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,FaceHandle fh,double radius,
          vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *face_neighbor)

{
  pointer *ppFVar1;
  iterator __position;
  int iVar2;
  BaseHandle BVar3;
  _Bit_type *p_Var4;
  pointer pFVar5;
  ulong uVar6;
  long lVar7;
  _Map_pointer ppFVar8;
  vector<bool,_std::allocator<bool>_> local_118;
  undefined1 local_f0 [8];
  Point ci;
  Point cj;
  undefined1 auStack_a8 [8];
  queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
  queue_face_handle;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> temp_face_neighbor;
  BaseHandle local_38;
  FaceHandle temp_face_handle_queue;
  FaceHandle fh_local;
  FaceHandle temp_face_handle;
  
  local_38 = fh.super_BaseHandle.idx_;
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::calc_face_centroid
            ((Point *)local_f0,
             (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)mesh,(FaceHandle)fh.super_BaseHandle.idx_);
  iVar2 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))(mesh);
  auStack_a8 = (undefined1  [8])((ulong)auStack_a8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_118,(long)iVar2,(bool *)auStack_a8,
             (allocator_type *)
             &queue_face_handle.c.
              super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node);
  pFVar5 = (face_neighbor->
           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((face_neighbor->
      super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
      super__Vector_impl_data._M_finish != pFVar5) {
    (face_neighbor->super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)
    ._M_impl.super__Vector_impl_data._M_finish = pFVar5;
  }
  BVar3.idx_ = (int)fh.super_BaseHandle.idx_ + 0x3f;
  if (-1 < (int)fh.super_BaseHandle.idx_) {
    BVar3 = fh.super_BaseHandle.idx_;
  }
  local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p
  [(long)(BVar3.idx_ >> 6) +
   ((ulong)(((long)(int)fh.super_BaseHandle.idx_ & 0x800000000000003fU) < 0x8000000000000001) - 1)]
       = local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p
         [(long)(BVar3.idx_ >> 6) +
          ((ulong)(((long)(int)fh.super_BaseHandle.idx_ & 0x800000000000003fU) < 0x8000000000000001)
          - 1)] | 1L << ((byte)fh.super_BaseHandle.idx_ & 0x3f);
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::_M_initialize_map
            ((_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_a8,
             0);
  if ((_Elt_pointer)
      queue_face_handle.c.
      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
      super__Deque_impl_data._M_start._M_node ==
      queue_face_handle.c.
      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first + -1) {
    std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>::
    _M_push_back_aux<OpenMesh::FaceHandle_const&>
              ((deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>> *)auStack_a8,
               (FaceHandle *)&local_38);
  }
  else {
    *(int *)queue_face_handle.c.
            super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
            super__Deque_impl_data._M_start._M_node = local_38.idx_;
    queue_face_handle.c.
    super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
    super__Deque_impl_data._M_start._M_node =
         (_Map_pointer)
         ((long)queue_face_handle.c.
                super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node + 4);
  }
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  temp_face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  temp_face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (queue_face_handle.c.
      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
      super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      queue_face_handle.c.
      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
      super__Deque_impl_data._M_map_size) {
    do {
      temp_face_neighbor.
      super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           *(int *)queue_face_handle.c.
                   super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                   _M_impl.super__Deque_impl_data._M_map_size;
      if (temp_face_neighbor.
          super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ != local_38.idx_) {
        __position._M_current =
             (face_neighbor->
             super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (face_neighbor->
            super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>::
          _M_realloc_insert<OpenMesh::FaceHandle_const&>
                    ((vector<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>> *)
                     face_neighbor,__position,
                     (FaceHandle *)
                     ((long)&temp_face_neighbor.
                             super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        }
        else {
          ((__position._M_current)->super_BaseHandle).idx_ =
               temp_face_neighbor.
               super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          ppFVar1 = &(face_neighbor->
                     super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppFVar1 = *ppFVar1 + 1;
        }
      }
      if ((_Elt_pointer)
          queue_face_handle.c.
          super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Deque_impl_data._M_map_size ==
          queue_face_handle.c.
          super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Deque_impl_data._M_start._M_first + -1) {
        operator_delete(queue_face_handle.c.
                        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur);
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_map_size =
             *(size_t *)
              (queue_face_handle.c.
               super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last + 2);
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_start._M_first =
             (_Elt_pointer)
             (queue_face_handle.c.
              super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl
              .super__Deque_impl_data._M_map_size + 0x200);
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur =
             (_Elt_pointer)
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_map_size;
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_start._M_last =
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_start._M_last + 2;
      }
      else {
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_map_size =
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_map_size + 4;
      }
      MeshDenoisingBase::getFaceNeighbor
                (&this->super_MeshDenoisingBase,mesh,
                 (FaceHandle)
                 temp_face_neighbor.
                 super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,kVertexBased,
                 (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                 &queue_face_handle.c.
                  super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node);
      ppFVar8 = queue_face_handle.c.
                super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node;
      if (0 < (int)((ulong)((long)temp_face_neighbor.
                                  super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_start -
                           (long)queue_face_handle.c.
                                 super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_node) >> 2)) {
        lVar7 = 0;
        p_Var4 = local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        pFVar5 = temp_face_neighbor.
                 super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          temp_face_handle_queue.super_BaseHandle.idx_ =
               (BaseHandle)((BaseHandle *)((long)ppFVar8 + lVar7 * 4))->idx_;
          uVar6 = (ulong)(int)temp_face_handle_queue.super_BaseHandle.idx_;
          BVar3.idx_ = (int)temp_face_handle_queue.super_BaseHandle.idx_ + 0x3f;
          if (-1 < (long)uVar6) {
            BVar3.idx_ = (int)temp_face_handle_queue.super_BaseHandle.idx_;
          }
          if ((p_Var4[(long)(BVar3.idx_ >> 6) +
                      ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
               (uVar6 & 0x3f) & 1) == 0) {
            OpenMesh::
            PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            ::calc_face_centroid
                      ((Point *)(ci.super_VectorDataT<double,_3>.values_ + 2),
                       (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        *)mesh,(FaceHandle)temp_face_handle_queue.super_BaseHandle.idx_);
            if (SQRT((ci.super_VectorDataT<double,_3>.values_[1] -
                     cj.super_VectorDataT<double,_3>.values_[1]) *
                     (ci.super_VectorDataT<double,_3>.values_[1] -
                     cj.super_VectorDataT<double,_3>.values_[1]) +
                     ((double)local_f0 - ci.super_VectorDataT<double,_3>.values_[2]) *
                     ((double)local_f0 - ci.super_VectorDataT<double,_3>.values_[2]) +
                     (ci.super_VectorDataT<double,_3>.values_[0] -
                     cj.super_VectorDataT<double,_3>.values_[0]) *
                     (ci.super_VectorDataT<double,_3>.values_[0] -
                     cj.super_VectorDataT<double,_3>.values_[0])) <= radius) {
              if ((_Elt_pointer)
                  queue_face_handle.c.
                  super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node ==
                  queue_face_handle.c.
                  super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first + -1) {
                std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>::
                _M_push_back_aux<OpenMesh::FaceHandle_const&>
                          ((deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>> *)
                           auStack_a8,&temp_face_handle_queue);
              }
              else {
                *(BaseHandle *)
                 queue_face_handle.c.
                 super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_node =
                     temp_face_handle_queue.super_BaseHandle.idx_;
                queue_face_handle.c.
                super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node =
                     (_Map_pointer)
                     ((long)queue_face_handle.c.
                            super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node + 4);
              }
            }
            BVar3.idx_ = (int)temp_face_handle_queue.super_BaseHandle.idx_ + 0x3f;
            if (-1 < (long)(int)temp_face_handle_queue.super_BaseHandle.idx_) {
              BVar3 = temp_face_handle_queue.super_BaseHandle.idx_;
            }
            local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [(long)(BVar3.idx_ >> 6) +
             ((ulong)(((long)(int)temp_face_handle_queue.super_BaseHandle.idx_ & 0x800000000000003fU
                      ) < 0x8000000000000001) - 1)] =
                 local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)(BVar3.idx_ >> 6) +
                  ((ulong)(((long)(int)temp_face_handle_queue.super_BaseHandle.idx_ &
                           0x800000000000003fU) < 0x8000000000000001) - 1)] |
                 1L << ((byte)temp_face_handle_queue.super_BaseHandle.idx_ & 0x3f);
            p_Var4 = local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            pFVar5 = temp_face_neighbor.
                     super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            ppFVar8 = queue_face_handle.c.
                      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)((ulong)((long)pFVar5 - (long)ppFVar8) >> 2));
      }
    } while (queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_start._M_node !=
             (_Map_pointer)
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_map_size);
    if (ppFVar8 != (_Map_pointer)0x0) {
      operator_delete(ppFVar8);
    }
  }
  std::_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~_Deque_base
            ((_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_a8)
  ;
  if (local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::getRadiusBasedFaceNeighbor(TriMesh &mesh, TriMesh::FaceHandle fh, double radius, std::vector<TriMesh::FaceHandle> &face_neighbor)
{
    TriMesh::Point ci = mesh.calc_face_centroid(fh);
    std::vector<bool> flag((int)mesh.n_faces(), false);

    face_neighbor.clear();
    flag[fh.idx()] = true;
    std::queue<TriMesh::FaceHandle> queue_face_handle;
    queue_face_handle.push(fh);

    std::vector<TriMesh::FaceHandle> temp_face_neighbor;
    while(!queue_face_handle.empty())
    {
        TriMesh::FaceHandle temp_face_handle_queue = queue_face_handle.front();
        if(temp_face_handle_queue != fh)
            face_neighbor.push_back(temp_face_handle_queue);
        queue_face_handle.pop();
        getVertexBasedFaceNeighbor(mesh, temp_face_handle_queue, temp_face_neighbor);
        for(int i = 0; i < (int)temp_face_neighbor.size(); i++)
        {
            TriMesh::FaceHandle temp_face_handle = temp_face_neighbor[i];
            if(!flag[temp_face_handle.idx()])
            {
                TriMesh::Point cj = mesh.calc_face_centroid(temp_face_handle);
                double distance = (ci - cj).length();
                if(distance <= radius)
                    queue_face_handle.push(temp_face_handle);
                flag[temp_face_handle.idx()] = true;
            }
        }
    }
}